

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

bool ON_ArcToArcTransitionIsNotGsmooth
               (ON_Arc *arc0,ON_Arc *arc1,double cos_angle_tolerance,double curvature_tolerance)

{
  bool bVar1;
  ON_3dPoint *pOVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double local_130;
  double local_128;
  undefined1 local_120 [8];
  ON_2dVector D;
  double l1;
  double l0;
  double a1;
  double a0;
  undefined1 local_d8 [8];
  ON_3dVector V1;
  undefined1 local_a8 [8];
  ON_3dVector V0;
  ON_3dPoint local_78;
  double local_60;
  double d;
  double minr;
  double maxr;
  double r1;
  double r0;
  double tolerance;
  double curvature_tolerance_local;
  double cos_angle_tolerance_local;
  ON_Arc *arc1_local;
  ON_Arc *arc0_local;
  
  r0 = 2.3283064365386963e-10;
  tolerance = curvature_tolerance;
  curvature_tolerance_local = cos_angle_tolerance;
  cos_angle_tolerance_local = (double)arc1;
  arc1_local = arc0;
  bVar1 = ON_Arc::IsValid(arc0);
  if ((bVar1) && (bVar1 = ON_Arc::IsValid((ON_Arc *)cos_angle_tolerance_local), bVar1)) {
    r1 = ON_Circle::Radius(&arc1_local->super_ON_Circle);
    maxr = ON_Circle::Radius((ON_Circle *)cos_angle_tolerance_local);
    local_128 = maxr;
    if (maxr <= r1) {
      local_128 = r1;
    }
    minr = local_128;
    local_130 = maxr;
    if (r1 < maxr) {
      local_130 = r1;
    }
    d = local_130;
    if ((((0.0 < r1) && (0.0 < maxr)) && (local_128 < 1000000.0)) &&
       ((local_128 * 0.1 < ABS(r1 - maxr) && (tolerance < ABS(1.0 / r1 - 1.0 / maxr))))) {
      ON_Arc::EndPoint(&local_78,arc1_local);
      ON_Arc::StartPoint((ON_3dPoint *)&V0.z,(ON_Arc *)cos_angle_tolerance_local);
      local_60 = ON_3dPoint::DistanceTo(&local_78,(ON_3dPoint *)&V0.z);
      if ((local_60 <= 2.3283064365386963e-10) && (local_60 <= d * 0.01)) {
        dVar3 = ON_3dVector::operator*
                          (&(arc1_local->super_ON_Circle).plane.zaxis,
                           (ON_3dVector *)((long)cos_angle_tolerance_local + 0x48));
        local_60 = dVar3;
        dVar4 = cos(0.05235987755982988);
        if (((dVar4 <= dVar3) || (curvature_tolerance_local <= local_60)) ||
           (local_60 < 1.0000000149011612)) {
          ON_Arc::EndPoint((ON_3dPoint *)&V1.z,arc1_local);
          pOVar2 = ON_Circle::Center(&arc1_local->super_ON_Circle);
          ON_3dPoint::operator-((ON_3dVector *)local_a8,(ON_3dPoint *)&V1.z,pOVar2);
          ON_Arc::StartPoint((ON_3dPoint *)&a0,(ON_Arc *)cos_angle_tolerance_local);
          pOVar2 = ON_Circle::Center((ON_Circle *)cos_angle_tolerance_local);
          ON_3dPoint::operator-((ON_3dVector *)local_d8,(ON_3dPoint *)&a0,pOVar2);
          ON_3dVector::Unitize((ON_3dVector *)local_a8);
          ON_3dVector::Unitize((ON_3dVector *)local_d8);
          dVar3 = ON_3dVector::operator*((ON_3dVector *)local_a8,(ON_3dVector *)local_d8);
          local_60 = dVar3;
          dVar4 = cos(0.05235987755982988);
          if (((dVar4 <= dVar3) || (curvature_tolerance_local <= local_60)) ||
             (local_60 < 1.0000000149011612)) {
            dVar3 = ON_Arc::AngleRadians(arc1_local);
            a1 = ABS(dVar3);
            dVar3 = ON_Arc::AngleRadians((ON_Arc *)cos_angle_tolerance_local);
            l0 = ABS(dVar3);
            if (3.141592653589793 < a1) {
              a1 = 3.141592653589793;
            }
            if (3.141592653589793 < l0) {
              l0 = 3.141592653589793;
            }
            dVar3 = r1 * a1;
            D.y = maxr * l0;
            if (dVar3 <= D.y) {
              if (dVar3 < D.y) {
                l0 = dVar3 / maxr;
              }
            }
            else {
              a1 = D.y / r1;
            }
            if ((2.3283064365386963e-10 < dVar3) && (2.3283064365386963e-10 < D.y)) {
              dVar5 = 1.0 - r1;
              dVar6 = cos(a1);
              dVar7 = maxr - 1.0;
              dVar8 = cos(l0);
              dVar4 = r1;
              dVar9 = sin(a1);
              dVar3 = maxr;
              dVar10 = sin(l0);
              ON_2dVector::ON_2dVector
                        ((ON_2dVector *)local_120,dVar5 * dVar6 + dVar7 * dVar8,
                         dVar4 * dVar9 + -(dVar3 * dVar10));
              dVar3 = ON_2dVector::Length((ON_2dVector *)local_120);
              if ((2.3283064365386963e-10 < dVar3) && (minr * 0.1 < dVar3)) {
                return true;
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

static bool ON_ArcToArcTransitionIsNotGsmooth(
  const ON_Arc& arc0,
  const ON_Arc& arc1,
  double cos_angle_tolerance,
  double curvature_tolerance
  )
{
  const double tolerance = ON_ZERO_TOLERANCE;
  if ( !arc0.IsValid() )
    return false;
  if ( !arc1.IsValid() )
    return false;

  const double r0 = arc0.Radius();
  const double r1 = arc1.Radius();
  const double maxr = (r0 >= r1) ? r0 : r1;
  const double minr = (r0 >= r1) ? r1 : r0;
  if ( !(r0 > 0.0 && r1 > 0.0 && maxr < 1.0e6) )
    return false;

  // Please discuss any changes to this 10% max radius
  // test with Dale Lear.
  // This function detects aesthetic changes - it is not
  // intended to be used for any other purpose.
  if ( !(fabs(r0-r1) > 0.1*maxr) )
    return false;

  if ( fabs(1.0/r0 - 1.0/r1) <= curvature_tolerance )
    return false;

  // The end of arc0 and the start of arc1 must be coincident.
  double d = arc0.EndPoint().DistanceTo(arc1.StartPoint());
  if ( !(d <= tolerance && d <= 0.01*minr) )
    return false;

  // arcs must be coplanar
  d = arc0.plane.zaxis*arc1.plane.zaxis;
  if ( !(d >= cos(3.0*ON_PI/180.0)) && !(d >= cos_angle_tolerance) && !(d < 1.0+ON_SQRT_EPSILON) )
  {
    // arcs are not coplanar
    return false;
  }

  // arcs must be tangent and have centers on the same side of the common point.
  ON_3dVector V0 = arc0.EndPoint() - arc0.Center();
  ON_3dVector V1 = arc1.StartPoint() - arc1.Center();
  V0.Unitize();
  V1.Unitize();
  d = V0*V1;
  if ( !(d >= cos(3.0*ON_PI/180.0)) && !(d >= cos_angle_tolerance) && !(d < 1.0+ON_SQRT_EPSILON) )
  {
    // arcs are not tangent or do not have their centers on
    // the same side of the common point.
    return false;
  }

  // If the arcs started at the same location,
  // they were tangent at the start, and they
  // were both the length of the shortest arc,
  // then we should be able to "see" the difference
  // in the end points.
  double a0 = fabs(arc0.AngleRadians());
  double a1 = fabs(arc1.AngleRadians());
  if (a0 > ON_PI)
    a0 = ON_PI;
  if (a1 > ON_PI)
    a1 = ON_PI;
  double l0 = r0*a0;
  double l1 = r1*a1;
  if ( l0 > l1 )
  {
    a0 = l1/r0;
  }
  else if ( l1 > l0 )
  {
    a1 = l0/r1;
  }
  if ( l0 > tolerance && l1 > tolerance )
  {
    ON_2dVector D((1.0-r0)*cos(a0) + (r1-1.0)*cos(a1),r0*sin(a0)-r1*sin(a1));
    d = D.Length();
    if ( d > tolerance && d > 0.1*maxr )
      return true; // "visibly" different
  }

  return false;
}